

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O1

ai_real __thiscall
Assimp::ImproveCacheLocalityProcess::ProcessMesh
          (ImproveCacheLocalityProcess *this,aiMesh *pMesh,uint meshNum)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  aiFace *paVar6;
  void *__s;
  uint *puVar7;
  Logger *pLVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint *puVar19;
  ulong uVar20;
  aiFace *paVar21;
  ulong uVar22;
  ulong uVar23;
  ai_real aVar24;
  float fVar25;
  stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> sDeadEndVStack;
  vector<bool,_std::allocator<bool>_> abEmitted;
  vector<unsigned_int,_std::allocator<unsigned_int>_> piNumTriPtrNoModify;
  VertexTriangleAdjacency adj;
  char szBuff [128];
  float local_2bc;
  uint *local_2b8;
  uint local_2ac;
  uint local_294;
  uint *local_288;
  iterator iStack_280;
  uint *local_278;
  uint *local_270;
  void *local_268;
  uint local_25c;
  int local_258;
  int local_254;
  vector<bool,_std::allocator<bool>_> local_250;
  aiFace *local_228;
  aiMesh *local_220;
  ulong local_218;
  ulong local_210;
  uint *local_208;
  void *local_200 [2];
  long local_1f0;
  VertexTriangleAdjacency local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                  ,0x7a,
                  "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                 );
  }
  if (pMesh->mNumFaces == 0 || pMesh->mFaces == (aiFace *)0x0) {
    return 0.0;
  }
  if (pMesh->mNumVertices == 0 || pMesh->mVertices == (aiVector3D *)0x0) {
    return 0.0;
  }
  if (pMesh->mPrimitiveTypes == 4) {
    if (pMesh->mNumVertices <= this->mConfigCacheDepth) {
      return 0.0;
    }
    paVar21 = pMesh->mFaces + pMesh->mNumFaces;
    bVar4 = DefaultLogger::isNullLogger();
    if (bVar4) {
      local_2bc = 3.0;
    }
    else {
      uVar15 = this->mConfigCacheDepth;
      uVar22 = (ulong)uVar15 * 4;
      puVar5 = (uint *)operator_new__(uVar22);
      memset(puVar5,0xff,uVar22);
      paVar6 = pMesh->mFaces;
      if (paVar6 == paVar21) {
        local_2bc = 0.0;
      }
      else {
        uVar9 = 0;
        puVar7 = puVar5;
        do {
          lVar16 = 0;
          do {
            if (uVar15 != 0) {
              puVar19 = puVar5;
              do {
                if (*puVar19 == paVar6->mIndices[lVar16]) goto LAB_0036ade1;
                puVar19 = puVar19 + 1;
              } while (puVar19 < puVar5 + uVar15);
            }
            uVar9 = uVar9 + 1;
            if (puVar5 + uVar15 == puVar7) {
              puVar7 = puVar5;
            }
            *puVar7 = paVar6->mIndices[lVar16];
            puVar7 = puVar7 + 1;
LAB_0036ade1:
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          paVar6 = paVar6 + 1;
        } while (paVar6 != paVar21);
        local_2bc = (float)uVar9;
      }
      operator_delete__(puVar5);
      local_2bc = local_2bc / (float)pMesh->mNumFaces;
      if ((local_2bc == 3.0) && (!NAN(local_2bc))) {
        snprintf(local_1a8,0x80,"Mesh %u: Not suitable for vcache optimization",(ulong)meshNum);
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,local_1a8);
        goto LAB_0036ad62;
      }
    }
    VertexTriangleAdjacency::VertexTriangleAdjacency
              (&local_1e8,pMesh->mFaces,pMesh->mNumFaces,pMesh->mNumVertices,true);
    uVar22 = (ulong)pMesh->mNumVertices << 2;
    __s = operator_new__(uVar22);
    memset(__s,0,uVar22);
    uVar15 = pMesh->mNumFaces;
    local_270 = (uint *)operator_new__((ulong)(uVar15 * 3) << 2);
    local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_250,(ulong)uVar15,(bool *)local_1a8,(allocator_type *)local_1c8);
    puVar5 = local_1e8.mLiveTriangles;
    local_288 = (uint *)0x0;
    iStack_280._M_current = (uint *)0x0;
    local_278 = (uint *)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_200,
               local_1e8.mLiveTriangles,local_1e8.mLiveTriangles + pMesh->mNumVertices,
               (allocator_type *)local_1a8);
    if ((ulong)pMesh->mNumVertices == 0) {
      uVar15 = 0;
    }
    else {
      lVar16 = 0;
      uVar15 = 0;
      do {
        if (uVar15 <= *(uint *)((long)local_1e8.mLiveTriangles + lVar16)) {
          uVar15 = *(uint *)((long)local_1e8.mLiveTriangles + lVar16);
        }
        lVar16 = lVar16 + 4;
      } while ((ulong)pMesh->mNumVertices << 2 != lVar16);
    }
    if (uVar15 == 0) {
      __assert_fail("iMaxRefTris > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                    ,0xda,
                    "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                   );
    }
    local_25c = meshNum;
    local_228 = paVar21;
    puVar7 = (uint *)operator_new__((ulong)(uVar15 * 3) << 2);
    iVar13 = this->mConfigCacheDepth + 1;
    local_2ac = 1;
    uVar15 = 0;
    local_294 = 0;
    local_2b8 = local_270;
    local_268 = __s;
    local_220 = pMesh;
    do {
      if (local_1e8.mNumVertices <= uVar15) {
        __assert_fail("iVertIndex < mNumVertices",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/VertexTriangleAdjacency.h"
                      ,0x57,
                      "unsigned int *Assimp::VertexTriangleAdjacency::GetAdjacentTriangles(unsigned int) const"
                     );
      }
      uVar22 = (ulong)uVar15;
      iVar11 = *(int *)((long)local_200[0] + uVar22 * 4);
      puVar19 = puVar7;
      if (iVar11 != 0) {
        puVar12 = local_1e8.mAdjacencyTable + local_1e8.mOffsetTable[uVar22];
        iVar17 = 0;
        local_258 = iVar11;
        do {
          uVar9 = *puVar12;
          uVar10 = (ulong)uVar9;
          uVar18 = 1L << ((byte)uVar9 & 0x3f);
          uVar20 = (ulong)(uVar9 >> 6);
          if ((local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar20] >> (uVar10 & 0x3f) & 1) == 0) {
            paVar21 = pMesh->mFaces;
            uVar23 = (ulong)paVar21[uVar10].mNumIndices;
            if (uVar23 != 0) {
              lVar16 = 0;
              local_254 = iVar17;
              local_218 = uVar20;
              local_210 = uVar18;
              local_208 = puVar12;
              do {
                local_1a8._0_4_ = *(uint *)((long)paVar21[uVar10].mIndices + lVar16);
                if (uVar15 != local_1a8._0_4_) {
                  if (iStack_280._M_current == local_278) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_288,
                               iStack_280,(uint *)local_1a8);
                  }
                  else {
                    *iStack_280._M_current = local_1a8._0_4_;
                    iStack_280._M_current = iStack_280._M_current + 1;
                  }
                  *puVar19 = local_1a8._0_4_;
                  puVar19 = puVar19 + 1;
                  puVar5[(uint)local_1a8._0_4_] = puVar5[(uint)local_1a8._0_4_] - 1;
                }
                *(undefined4 *)((long)local_2b8 + lVar16) = local_1a8._0_4_;
                if (this->mConfigCacheDepth <
                    (uint)(iVar13 - *(int *)((long)local_268 + (ulong)(uint)local_1a8._0_4_ * 4))) {
                  *(int *)((long)local_268 + (ulong)(uint)local_1a8._0_4_ * 4) = iVar13;
                  iVar13 = iVar13 + 1;
                  local_294 = local_294 + 1;
                }
                lVar16 = lVar16 + 4;
              } while (uVar23 << 2 != lVar16);
              local_2b8 = (uint *)((long)local_2b8 + lVar16);
              puVar12 = local_208;
              uVar18 = local_210;
              uVar20 = local_218;
              iVar11 = local_258;
              iVar17 = local_254;
            }
            local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar20] =
                 local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20] | uVar18;
            pMesh = local_220;
          }
          puVar12 = puVar12 + 1;
          iVar17 = iVar17 + 1;
        } while (iVar17 != iVar11);
      }
      puVar5[uVar22] = 0;
      if (puVar7 == puVar19) {
        uVar15 = 0xffffffff;
      }
      else {
        iVar11 = -1;
        uVar9 = 0xffffffff;
        uVar15 = 0xffffffff;
        puVar12 = puVar7;
        do {
          uVar14 = *puVar12;
          iVar17 = iVar11;
          uVar3 = uVar9;
          if (puVar5[uVar14] != 0) {
            iVar17 = iVar13 - *(int *)((long)local_268 + (ulong)uVar14 * 4);
            if (this->mConfigCacheDepth < iVar17 + puVar5[uVar14] * 2) {
              iVar17 = 0;
            }
            uVar15 = uVar14;
            uVar3 = uVar14;
            if (iVar17 <= iVar11) {
              uVar15 = uVar9;
              iVar17 = iVar11;
              uVar3 = uVar9;
            }
          }
          uVar9 = uVar3;
          iVar11 = iVar17;
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar19);
      }
      if (uVar15 == 0xffffffff) {
        do {
          uVar15 = 0xffffffff;
          puVar19 = iStack_280._M_current + -1;
          if (iStack_280._M_current == local_288) break;
          uVar15 = *puVar19;
          iStack_280._M_current = puVar19;
        } while (puVar5[uVar15] == 0);
        if (uVar15 == 0xffffffff) {
          uVar9 = pMesh->mNumVertices;
          lVar16 = (long)(int)local_2ac;
          uVar14 = uVar9;
          if ((int)uVar9 < (int)local_2ac) {
            uVar14 = local_2ac;
          }
          do {
            local_2ac = uVar14;
            if ((int)uVar9 <= lVar16) goto LAB_0036b1ea;
            lVar1 = lVar16 + 1;
            lVar2 = lVar16 + 1;
            lVar16 = lVar1;
          } while (puVar5[lVar2] == 0);
          uVar15 = (uint)lVar1;
          local_2ac = uVar15;
        }
      }
LAB_0036b1ea:
    } while (-1 < (int)uVar15);
    bVar4 = DefaultLogger::isNullLogger();
    paVar21 = local_228;
    aVar24 = 0.0;
    if (!bVar4) {
      uVar15 = pMesh->mNumFaces;
      pLVar8 = DefaultLogger::get();
      fVar25 = (float)local_294 / (float)uVar15;
      if (pLVar8->m_Severity == VERBOSE) {
        pLVar8 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[20]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [20])"Mesh %u | ACMR in: ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," out: ",6);
        std::ostream::_M_insert<double>((double)local_2bc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," | ~",4);
        std::ostream::_M_insert<double>((double)fVar25);
        std::ostream::_M_insert<double>((double)(((local_2bc - fVar25) / local_2bc) * 100.0));
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar8,(char *)local_1c8[0]);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      aVar24 = fVar25 * (float)pMesh->mNumFaces;
    }
    puVar5 = local_270;
    for (paVar6 = pMesh->mFaces; paVar6 != paVar21; paVar6 = paVar6 + 1) {
      uVar15 = paVar6->mNumIndices;
      puVar19 = paVar6->mIndices;
      if (uVar15 != 0) {
        uVar9 = *puVar5;
        puVar5 = puVar5 + 1;
        *puVar19 = uVar9;
      }
      if (1 < uVar15) {
        uVar9 = *puVar5;
        puVar5 = puVar5 + 1;
        puVar19[1] = uVar9;
      }
      if (2 < uVar15) {
        uVar15 = *puVar5;
        puVar5 = puVar5 + 1;
        puVar19[2] = uVar15;
      }
    }
    operator_delete__(local_268);
    operator_delete__(local_270);
    operator_delete__(puVar7);
    if (local_200[0] != (void *)0x0) {
      operator_delete(local_200[0],local_1f0 - (long)local_200[0]);
    }
    if (local_288 != (uint *)0x0) {
      operator_delete(local_288,(long)local_278 - (long)local_288);
    }
    if (local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    VertexTriangleAdjacency::~VertexTriangleAdjacency(&local_1e8);
  }
  else {
    pLVar8 = DefaultLogger::get();
    Logger::error(pLVar8,"This algorithm works on triangle meshes only");
LAB_0036ad62:
    aVar24 = 0.0;
  }
  return aVar24;
}

Assistant:

ai_real ImproveCacheLocalityProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshNum) {
    // TODO: rewrite this to use std::vector or boost::shared_array
    ai_assert(nullptr != pMesh);

    // Check whether the input data is valid
    // - there must be vertices and faces
    // - all faces must be triangulated or we can't operate on them
    if (!pMesh->HasFaces() || !pMesh->HasPositions())
        return static_cast<ai_real>(0.f);

    if (pMesh->mPrimitiveTypes != aiPrimitiveType_TRIANGLE) {
        ASSIMP_LOG_ERROR("This algorithm works on triangle meshes only");
        return static_cast<ai_real>(0.f);
    }

    if(pMesh->mNumVertices <= mConfigCacheDepth) {
        return static_cast<ai_real>(0.f);
    }

    ai_real fACMR = 3.f;
    const aiFace* const pcEnd = pMesh->mFaces+pMesh->mNumFaces;

    // Input ACMR is for logging purposes only
    if (!DefaultLogger::isNullLogger())     {

        unsigned int* piFIFOStack = new unsigned int[mConfigCacheDepth];
        memset(piFIFOStack,0xff,mConfigCacheDepth*sizeof(unsigned int));
        unsigned int* piCur = piFIFOStack;
        const unsigned int* const piCurEnd = piFIFOStack + mConfigCacheDepth;

        // count the number of cache misses
        unsigned int iCacheMisses = 0;
        for (const aiFace* pcFace = pMesh->mFaces;pcFace != pcEnd;++pcFace) {
            for (unsigned int qq = 0; qq < 3;++qq) {
                bool bInCache = false;
                for (unsigned int* pp = piFIFOStack;pp < piCurEnd;++pp) {
                    if (*pp == pcFace->mIndices[qq])    {
                        // the vertex is in cache
                        bInCache = true;
                        break;
                    }
                }
                if (!bInCache)  {
                    ++iCacheMisses;
                    if (piCurEnd == piCur) {
                        piCur = piFIFOStack;
                    }
                    *piCur++ = pcFace->mIndices[qq];
                }
            }
        }
        delete[] piFIFOStack;
        fACMR = (ai_real) iCacheMisses / pMesh->mNumFaces;
        if (3.0 == fACMR)   {
            char szBuff[128]; // should be sufficiently large in every case

            // the JoinIdenticalVertices process has not been executed on this
            // mesh, otherwise this value would normally be at least minimally
            // smaller than 3.0 ...
            ai_snprintf(szBuff,128,"Mesh %u: Not suitable for vcache optimization",meshNum);
            ASSIMP_LOG_WARN(szBuff);
            return static_cast<ai_real>(0.f);
        }
    }

    // first we need to build a vertex-triangle adjacency list
    VertexTriangleAdjacency adj(pMesh->mFaces,pMesh->mNumFaces, pMesh->mNumVertices,true);

    // build a list to store per-vertex caching time stamps
    unsigned int* const piCachingStamps = new unsigned int[pMesh->mNumVertices];
    memset(piCachingStamps,0x0,pMesh->mNumVertices*sizeof(unsigned int));

    // allocate an empty output index buffer. We store the output indices in one large array.
    // Since the number of triangles won't change the input faces can be reused. This is how
    // we save thousands of redundant mini allocations for aiFace::mIndices
    const unsigned int iIdxCnt = pMesh->mNumFaces*3;
    unsigned int* const piIBOutput = new unsigned int[iIdxCnt];
    unsigned int* piCSIter = piIBOutput;

    // allocate the flag array to hold the information
    // whether a face has already been emitted or not
    std::vector<bool> abEmitted(pMesh->mNumFaces,false);

    // dead-end vertex index stack
    std::stack<unsigned int, std::vector<unsigned int> > sDeadEndVStack;

    // create a copy of the piNumTriPtr buffer
    unsigned int* const piNumTriPtr = adj.mLiveTriangles;
    const std::vector<unsigned int> piNumTriPtrNoModify(piNumTriPtr, piNumTriPtr + pMesh->mNumVertices);

    // get the largest number of referenced triangles and allocate the "candidate buffer"
    unsigned int iMaxRefTris = 0; {
        const unsigned int* piCur = adj.mLiveTriangles;
        const unsigned int* const piCurEnd = adj.mLiveTriangles+pMesh->mNumVertices;
        for (;piCur != piCurEnd;++piCur) {
            iMaxRefTris = std::max(iMaxRefTris,*piCur);
        }
    }
    ai_assert(iMaxRefTris > 0);
    unsigned int* piCandidates = new unsigned int[iMaxRefTris*3];
    unsigned int iCacheMisses = 0;

    // ...................................................................................
    /** PSEUDOCODE for the algorithm

        A = Build-Adjacency(I) Vertex-triangle adjacency
        L = Get-Triangle-Counts(A) Per-vertex live triangle counts
        C = Zero(Vertex-Count(I)) Per-vertex caching time stamps
        D = Empty-Stack() Dead-end vertex stack
        E = False(Triangle-Count(I)) Per triangle emitted flag
        O = Empty-Index-Buffer() Empty output buffer
        f = 0 Arbitrary starting vertex
        s = k+1, i = 1 Time stamp and cursor
        while f >= 0 For all valid fanning vertices
            N = Empty-Set() 1-ring of next candidates
            for each Triangle t in Neighbors(A, f)
                if !Emitted(E,t)
                    for each Vertex v in t
                        Append(O,v) Output vertex
                        Push(D,v) Add to dead-end stack
                        Insert(N,v) Register as candidate
                        L[v] = L[v]-1 Decrease live triangle count
                        if s-C[v] > k If not in cache
                            C[v] = s Set time stamp
                            s = s+1 Increment time stamp
                    E[t] = true Flag triangle as emitted
            Select next fanning vertex
            f = Get-Next-Vertex(I,i,k,N,C,s,L,D)
        return O
        */
    // ...................................................................................

    int ivdx = 0;
    int ics = 1;
    int iStampCnt = mConfigCacheDepth+1;
    while (ivdx >= 0)   {

        unsigned int icnt = piNumTriPtrNoModify[ivdx];
        unsigned int* piList = adj.GetAdjacentTriangles(ivdx);
        unsigned int* piCurCandidate = piCandidates;

        // get all triangles in the neighborhood
        for (unsigned int tri = 0; tri < icnt;++tri)    {

            // if they have not yet been emitted, add them to the output IB
            const unsigned int fidx = *piList++;
            if (!abEmitted[fidx])   {

                // so iterate through all vertices of the current triangle
                const aiFace* pcFace = &pMesh->mFaces[ fidx ];
                unsigned nind = pcFace->mNumIndices;
                for (unsigned ind = 0; ind < nind; ind++) {
                    unsigned dp = pcFace->mIndices[ind];

                    // the current vertex won't have any free triangles after this step
                    if (ivdx != (int)dp) {
                        // append the vertex to the dead-end stack
                        sDeadEndVStack.push(dp);

                        // register as candidate for the next step
                        *piCurCandidate++ = dp;

                        // decrease the per-vertex triangle counts
                        piNumTriPtr[dp]--;
                    }

                    // append the vertex to the output index buffer
                    *piCSIter++ = dp;

                    // if the vertex is not yet in cache, set its cache count
                    if (iStampCnt-piCachingStamps[dp] > mConfigCacheDepth) {
                        piCachingStamps[dp] = iStampCnt++;
                        ++iCacheMisses;
                    }
                }
                // flag triangle as emitted
                abEmitted[fidx] = true;
            }
        }

        // the vertex has now no living adjacent triangles anymore
        piNumTriPtr[ivdx] = 0;

        // get next fanning vertex
        ivdx = -1;
        int max_priority = -1;
        for (unsigned int* piCur = piCandidates;piCur != piCurCandidate;++piCur)    {
            const unsigned int dp = *piCur;

            // must have live triangles
            if (piNumTriPtr[dp] > 0)    {
                int priority = 0;

                // will the vertex be in cache, even after fanning occurs?
                unsigned int tmp;
                if ((tmp = iStampCnt-piCachingStamps[dp]) + 2*piNumTriPtr[dp] <= mConfigCacheDepth) {
                    priority = tmp;
                }

                // keep best candidate
                if (priority > max_priority) {
                    max_priority = priority;
                    ivdx = dp;
                }
            }
        }
        // did we reach a dead end?
        if (-1 == ivdx) {
            // need to get a non-local vertex for which we have a good chance that it is still
            // in the cache ...
            while (!sDeadEndVStack.empty()) {
                unsigned int iCachedIdx = sDeadEndVStack.top();
                sDeadEndVStack.pop();
                if (piNumTriPtr[ iCachedIdx ] > 0)  {
                    ivdx = iCachedIdx;
                    break;
                }
            }

            if (-1 == ivdx) {
                // well, there isn't such a vertex. Simply get the next vertex in input order and
                // hope it is not too bad ...
                while (ics < (int)pMesh->mNumVertices)  {
                    ++ics;
                    if (piNumTriPtr[ics] > 0)   {
                        ivdx = ics;
                        break;
                    }
                }
            }
        }
    }
    ai_real fACMR2 = 0.0f;
    if (!DefaultLogger::isNullLogger()) {
        fACMR2 = (float)iCacheMisses / pMesh->mNumFaces;

        // very intense verbose logging ... prepare for much text if there are many meshes
        if ( DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE) {
            ASSIMP_LOG_DEBUG_F("Mesh %u | ACMR in: ", meshNum, " out: ", fACMR, " | ~", fACMR2, ((fACMR - fACMR2) / fACMR) * 100.f);
        }

        fACMR2 *= pMesh->mNumFaces;
    }
    // sort the output index buffer back to the input array
    piCSIter = piIBOutput;
    for (aiFace* pcFace = pMesh->mFaces; pcFace != pcEnd;++pcFace)  {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) ind[0] = *piCSIter++;
        if (nind > 1) ind[1] = *piCSIter++;
        if (nind > 2) ind[2] = *piCSIter++;
    }

    // delete temporary storage
    delete[] piCachingStamps;
    delete[] piIBOutput;
    delete[] piCandidates;

    return fACMR2;
}